

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandQuaRel(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  uint fInputs;
  char *pcVar5;
  uint local_44;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  local_44 = 0;
  Extra_UtilGetoptReset();
  fInputs = 1;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Iqvh"), iVar2 = globalUtilOptind, iVar1 != 0x49) {
      if (iVar1 == -1) {
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          pcVar4 = "Empty network.\n";
        }
        else {
          iVar2 = Abc_NtkGetChoiceNum(pAVar3);
          if (iVar2 == 0) {
            if (pAVar3->nObjCounts[8] != 0) {
              if (pAVar3->ntkType == ABC_NTK_STRASH) {
                pAVar3 = Abc_NtkTransRel(pAVar3,fInputs,local_44);
              }
              else {
                pNtk = Abc_NtkStrash(pAVar3,0,1,0);
                pAVar3 = Abc_NtkTransRel(pNtk,fInputs,local_44);
                Abc_NtkDelete(pNtk);
              }
              if (pAVar3 != (Abc_Ntk_t *)0x0) {
                Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
                return 0;
              }
              Abc_Print(-1,"Command has failed.\n");
              return 0;
            }
            pcVar4 = "This command works only for sequential circuits.\n";
          }
          else {
            pcVar4 = "This command cannot be applied to an AIG with choice nodes.\n";
          }
        }
        iVar2 = -1;
        goto LAB_00210261;
      }
      if (iVar1 == 0x71) {
        fInputs = fInputs ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto LAB_002101d8;
        local_44 = local_44 ^ 1;
      }
    }
    if (argc <= globalUtilOptind) break;
    iVar1 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if (iVar1 < 0) {
LAB_002101d8:
      Abc_Print(-2,"usage: qrel [-qvh]\n");
      Abc_Print(-2,"\t         computes transition relation of the sequential network\n");
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (fInputs == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-q     : perform quantification of inputs [default = %s]\n",pcVar4);
      if (local_44 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar2 = -2;
LAB_00210261:
      Abc_Print(iVar2,pcVar4);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
  goto LAB_002101d8;
}

Assistant:

int Abc_CommandQuaRel( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, iVar, fInputs, fVerbose;
    extern Abc_Ntk_t * Abc_NtkTransRel( Abc_Ntk_t * pNtk, int fInputs, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    iVar = 0;
    fInputs = 1;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Iqvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            iVar = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iVar < 0 )
                goto usage;
            break;
        case 'q':
            fInputs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkGetChoiceNum( pNtk ) )
    {
        Abc_Print( -1, "This command cannot be applied to an AIG with choice nodes.\n" );
        return 1;
    }
    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "This command works only for sequential circuits.\n" );
        return 1;
    }

    // get the strashed network
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        pNtk = Abc_NtkStrash( pNtk, 0, 1, 0 );
        pNtkRes = Abc_NtkTransRel( pNtk, fInputs, fVerbose );
        Abc_NtkDelete( pNtk );
    }
    else
        pNtkRes = Abc_NtkTransRel( pNtk, fInputs, fVerbose );
    // check if the result is available
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: qrel [-qvh]\n" );
    Abc_Print( -2, "\t         computes transition relation of the sequential network\n" );
//    Abc_Print( -2, "\t-I num : the zero-based index of a variable to quantify [default = %d]\n", iVar );
    Abc_Print( -2, "\t-q     : perform quantification of inputs [default = %s]\n", fInputs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}